

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BigDictionaryTypeHandler * __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::ConvertToBigDictionaryTypeHandler
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  DynamicType *oldType;
  DictionaryPropertyDescriptor<unsigned_short> DVar1;
  code *pcVar2;
  DynamicObject *instance_00;
  byte bVar3;
  bool bVar4;
  PropertyTypes values;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar8;
  PropertyRecord **ppPVar9;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  PropertyRecord *local_68;
  PropertyRecord *propertyId;
  DynamicObject *local_58;
  DynamicType *local_50;
  RecyclerWeakReference<Js::DynamicObject> *local_48;
  undefined1 local_40 [8];
  DictionaryPropertyDescriptor<int> bigDescriptor;
  BigDictionaryTypeHandler *this_00;
  
  iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x69])
                    (this,((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                           ->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (ulong)(uint)(this->super_DynamicTypeHandler).slotCapacity,
                     (ulong)(this->super_DynamicTypeHandler).inlineSlotCapacity,
                     (ulong)(this->super_DynamicTypeHandler).offsetOfInlineSlots);
  this_00 = (BigDictionaryTypeHandler *)CONCAT44(extraout_var,iVar5);
  bVar3 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_00);
  if ((bVar3 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x80f,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar4) goto LAB_00db1c06;
    *puVar7 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  local_48 = GetSingletonInstance(this);
  local_50 = oldType;
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"DictionaryTypeHandler",L"BigDictionaryTypeHandler",instance,
             &this->super_DynamicTypeHandler,oldType,local_48);
  local_58 = instance;
  CopySingletonInstance(this,instance,(DynamicTypeHandler *)this_00);
  local_40[0] = PreventFalseReference;
  local_40[1] = '\a';
  local_40._4_4_ = -1;
  bigDescriptor.flags = ~None;
  bigDescriptor.Attributes = 0xff;
  bigDescriptor._2_2_ = 0xffff;
  bigDescriptor.Data = -1;
  this_01 = (this->propertyMap).ptr;
  if (0 < this_01->count - this_01->freeCount) {
    iVar5 = 0;
    propertyId = (PropertyRecord *)this_00;
    do {
      pDVar8 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_01,iVar5);
      DVar1 = *pDVar8;
      ppPVar9 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,iVar5);
      this_00 = (BigDictionaryTypeHandler *)propertyId;
      local_68 = *ppPVar9;
      uVar6 = -(uint)((~(ulong)DVar1 & 0xffff00000000) == 0) | DVar1._4_4_ & 0xffff;
      bigDescriptor.Data = (int)DVar1.Setter;
      if ((ulong)DVar1 >> 0x30 == 0xffff) {
        bigDescriptor.Data = 0xffffffff;
      }
      bigDescriptor.flags = (char)uVar6;
      bigDescriptor.Attributes = (char)(uVar6 >> 8);
      bigDescriptor._2_2_ = (short)(uVar6 >> 0x10);
      local_40._4_4_ = -(uint)((~(ulong)DVar1 & 0xffff0000) == 0) | DVar1._2_4_ & 0xffff;
      local_40._0_2_ = DVar1._0_2_;
      JsUtil::
      BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)propertyId[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject,&local_68,
                 (DictionaryPropertyDescriptor<int> *)local_40);
      iVar5 = iVar5 + 1;
      this_01 = (this->propertyMap).ptr;
    } while (iVar5 < this_01->count - this_01->freeCount);
  }
  this_00->nextPropertyIndex = (uint)this->nextPropertyIndex;
  ClearSingletonInstance(this);
  if (((this_00->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x82e,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar4) goto LAB_00db1c06;
    *puVar7 = 0;
  }
  DynamicTypeHandler::SetFlags
            (&this_00->super_DynamicTypeHandler,(this->super_DynamicTypeHandler).flags & 0x20);
  DynamicTypeHandler::ChangeFlags
            (&this_00->super_DynamicTypeHandler,'\x01',(this->super_DynamicTypeHandler).flags);
  instance_00 = local_58;
  if (((this_00->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x833,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar4) goto LAB_00db1c06;
    *puVar7 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&this_00->super_DynamicTypeHandler,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler(&this_00->super_DynamicTypeHandler,instance_00,true);
  if ((this_00->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar4 = DynamicObject::HasSharedType(instance_00);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x83c,
                                  "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                  ,
                                  "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                                 );
      if (!bVar4) {
LAB_00db1c06:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  TraceFixedFieldsAfterTypeHandlerChange
            (instance_00,&this->super_DynamicTypeHandler,&this_00->super_DynamicTypeHandler,local_50
             ,local_48);
  return this_00;
}

Assistant:

BigDictionaryTypeHandler* DictionaryTypeHandlerBase<T>::ConvertToBigDictionaryTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        BigDictionaryTypeHandler* newTypeHandler = NewBigDictionaryTypeHandler(recycler, GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeTypeHandlerChange(_u("DictionaryTypeHandler"), _u("BigDictionaryTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif

        CopySingletonInstance(instance, newTypeHandler);
#endif

        DictionaryPropertyDescriptor<T> descriptor;
        DictionaryPropertyDescriptor<BigPropertyIndex> bigDescriptor;

        const PropertyRecord* propertyId;
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            descriptor = propertyMap->GetValueAt(i);
            propertyId = propertyMap->GetKeyAt(i);

            bigDescriptor.CopyFrom(descriptor);
            newTypeHandler->propertyMap->Add(propertyId, bigDescriptor);
        }

        newTypeHandler->nextPropertyIndex = nextPropertyIndex;

#if ENABLE_FIXED_FIELDS
        ClearSingletonInstance();
#endif

        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->ChangeFlags(IsExtensibleFlag, this->GetFlags());
        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        // Unlike for SimpleDictionaryTypeHandler or PathTypeHandler, the DictionaryTypeHandler copies usedAsFixed indiscriminately above.
        // Therefore, we don't care if we changed the type or not, and don't need the assert below.
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        // Assert(instance->GetType() != oldType);
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterTypeHandlerChange(instance, this, newTypeHandler, oldType, oldSingletonInstance);
#endif
#endif

        return newTypeHandler;
    }